

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormulaTransformer.cpp
# Opt level: O2

Formula * __thiscall
Kernel::PolarityAwareFormulaTransformer::applyImp(PolarityAwareFormulaTransformer *this,Formula *f)

{
  int iVar1;
  Formula *pFVar2;
  Formula *pFVar3;
  Formula *this_00;
  
  iVar1 = this->_polarity;
  this->_polarity = -iVar1;
  pFVar2 = FormulaTransformer::apply(&this->super_FormulaTransformer,*(Formula **)(f + 1));
  this->_polarity = iVar1;
  pFVar3 = FormulaTransformer::apply
                     (&this->super_FormulaTransformer,(Formula *)f[1]._label._M_dataplus._M_p);
  if ((pFVar2 != *(Formula **)(f + 1)) || (pFVar3 != (Formula *)f[1]._label._M_dataplus._M_p)) {
    this_00 = (Formula *)BinaryFormula::operator_new(0x38);
    Formula::Formula(this_00,f->_connective);
    *(Formula **)(this_00 + 1) = pFVar2;
    this_00[1]._label._M_dataplus._M_p = (pointer)pFVar3;
    f = this_00;
  }
  return f;
}

Assistant:

Formula* PolarityAwareFormulaTransformer::applyImp(Formula* f)
{
  ASS_EQ(f->connective(),IMP);

  Formula* newLeft;
  {
    ScopedLet<int> plet(_polarity, -_polarity);
    newLeft = apply(f->left());
  }
  Formula* newRight = apply(f->right());
  if(newLeft==f->left() && newRight==f->right()) {
    return f;
  }
  return new BinaryFormula(f->connective(), newLeft, newRight);
}